

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O0

void __thiscall
xLearn::Trainer::train
          (Trainer *this,vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *train_reader,
          vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *test_reader)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  undefined8 uVar4;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *in_RDI;
  undefined1 auVar5 [64];
  Trainer *unaff_retaddr;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *in_stack_00000020;
  Trainer *in_stack_00000028;
  index_t in_stack_00000038;
  bool in_stack_0000003f;
  real_t in_stack_00000040;
  real_t in_stack_00000044;
  real_t in_stack_00000048;
  real_t in_stack_0000004c;
  Trainer *in_stack_00000050;
  Model *in_stack_00000060;
  string metric_name;
  Trainer *in_stack_00000090;
  real_t tr_loss;
  Timer timer;
  int n;
  MetricInfo te_info;
  string metric_type;
  real_t prev_result;
  real_t best_result;
  int stop_window;
  int best_epoch;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  uint uVar6;
  value_type *in_stack_ffffffffffffff08;
  allocator *paVar7;
  float in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  string local_d0 [54];
  byte local_9a;
  allocator local_99;
  string local_98 [36];
  undefined8 local_74;
  real_t local_6c;
  uint local_54;
  undefined8 local_50;
  string local_48 [32];
  float local_28;
  float local_24;
  int local_20;
  uint local_1c;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *pvVar8;
  undefined1 extraout_var [56];
  
  local_1c = 0;
  local_20 = 0;
  local_24 = 0.0;
  local_28 = 0.0;
  pvVar8 = in_RDI;
  if (in_RDI[2].super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
      super__Vector_impl_data._M_finish == (pointer)0x0) {
    local_24 = 3.4028235e+38;
    local_28 = 1.1754944e-38;
  }
  else {
    (*(code *)((*in_RDI[2].super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->data_samples_).hash_value_1)(local_48);
    iVar2 = std::__cxx11::string::compare((char *)local_48);
    if ((((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)local_48), iVar2 == 0)) ||
        (iVar2 = std::__cxx11::string::compare((char *)local_48), iVar2 == 0)) ||
       ((iVar2 = std::__cxx11::string::compare((char *)local_48), iVar2 == 0 ||
        (iVar2 = std::__cxx11::string::compare((char *)local_48), iVar2 == 0)))) {
      local_24 = 1.1754944e-38;
      local_28 = 3.4028235e+38;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)local_48);
      if (((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)local_48), iVar2 == 0)) ||
         (iVar2 = std::__cxx11::string::compare((char *)local_48), iVar2 == 0)) {
        local_24 = 3.4028235e+38;
        local_28 = 1.1754944e-38;
      }
    }
    std::__cxx11::string::~string(local_48);
  }
  if (((ulong)in_RDI[1].super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
              _M_impl.super__Vector_impl_data._M_finish & 0x100000000) == 0) {
    std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::empty
              ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    show_head_info(in_stack_00000090,(bool)metric_name.field_2._M_local_buf[0xf]);
  }
  for (local_54 = 1;
      (int)local_54 <=
      *(int *)&in_RDI[1].super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
               _M_impl.super__Vector_impl_data._M_start; local_54 = local_54 + 1) {
    Timer::Timer((Timer *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    Timer::tic((Timer *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    local_6c = calc_gradient(unaff_retaddr,pvVar8);
    if (((ulong)in_RDI[1].super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
                _M_impl.super__Vector_impl_data._M_finish & 0x100000000) == 0) {
      bVar1 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::empty
                        ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                         CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      if (!bVar1) {
        auVar5._0_8_ = calc_metric(in_stack_00000028,in_stack_00000020);
        auVar5._8_56_ = extraout_var;
        local_74 = vmovlpd_avx(auVar5._0_16_);
        local_50 = local_74;
      }
      Timer::toc((Timer *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::empty
                ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      show_train_info(in_stack_00000050,in_stack_0000004c,in_stack_00000048,in_stack_00000044,
                      in_stack_00000040,in_stack_0000003f,in_stack_00000038);
      if (((ulong)in_RDI[1].super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
                  _M_impl.super__Vector_impl_data._M_start & 0x100000000) != 0) {
        if ((in_RDI[2].super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
             _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) ||
           (local_24 < (float)local_50)) {
          if (in_RDI[2].super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
              _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
            uVar3 = (*(code *)((*in_RDI[2].
                                 super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish)->data_samples_).
                              hash_value_2)(local_50._4_4_,local_24);
            if ((uVar3 & 1) != 0) goto LAB_001f7a5c;
          }
        }
        else {
LAB_001f7a5c:
          if (in_RDI[2].super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
              _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
            in_stack_ffffffffffffff14 = (float)local_50;
          }
          else {
            in_stack_ffffffffffffff14 = local_50._4_4_;
          }
          local_1c = local_54;
          local_24 = in_stack_ffffffffffffff14;
          Model::SetBestModel(in_stack_00000060);
        }
        if ((in_RDI[2].super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
             _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) ||
           ((float)local_50 <= local_28)) {
          if (in_RDI[2].super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
              _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
            uVar3 = (*(code *)((*in_RDI[2].
                                 super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish)->data_samples_).
                              hash_value_2)(local_50._4_4_,local_28);
            if ((uVar3 & 1) == 0) goto LAB_001f7b04;
          }
          local_20 = 0;
        }
        else {
LAB_001f7b04:
          if (local_20 ==
              *(int *)&in_RDI[1].
                       super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish) break;
          local_20 = local_20 + 1;
        }
        if (in_RDI[2].super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
            _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
          in_stack_ffffffffffffff10 = (float)local_50;
          local_28 = (float)local_50;
        }
        else {
          in_stack_ffffffffffffff10 = local_50._4_4_;
          local_28 = local_50._4_4_;
        }
      }
    }
  }
  if ((((ulong)in_RDI[1].super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
               _M_impl.super__Vector_impl_data._M_start & 0x100000000) == 0) ||
     (local_1c ==
      *(uint *)&in_RDI[1].super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
                _M_impl.super__Vector_impl_data._M_start)) {
    std::vector<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>::push_back
              ((vector<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
  }
  else {
    local_9a = 0;
    if (in_RDI[2].super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      paVar7 = &local_99;
      std::allocator<char>::allocator();
      local_9a = 1;
      std::__cxx11::string::string(local_98,"loss",paVar7);
    }
    else {
      (*(code *)((*in_RDI[2].super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->data_samples_).hash_value_1)
                (local_98);
    }
    if ((local_9a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    uVar6 = local_1c;
    uVar4 = std::__cxx11::string::c_str();
    StringPrintf_abi_cxx11_
              ((char *)(double)local_24,local_d0,"Early-stopping at epoch %d, best %s: %f",
               (ulong)uVar6,uVar4);
    Color::print_action((string *)CONCAT44(uVar6,in_stack_ffffffffffffff00));
    std::__cxx11::string::~string(local_d0);
    Model::Shrink((Model *)CONCAT44(uVar6,in_stack_ffffffffffffff00));
    std::__cxx11::string::~string(local_98);
  }
  return;
}

Assistant:

void Trainer::train(std::vector<Reader*>& train_reader,
                    std::vector<Reader*>& test_reader) {
  int best_epoch = 0;
  int stop_window = 0;
  real_t best_result = 0;
  real_t prev_result = 0;
  if (metric_ == nullptr) {
    best_result = kFloatMax;
    prev_result = kFloatMin;
  } else {
    std::string metric_type = metric_->metric_type();
    // Classification
    if (metric_type.compare("Accuracy") == 0 ||
        metric_type.compare("Precision") == 0 ||
        metric_type.compare("Recall") == 0 ||
        metric_type.compare("F1") == 0 ||
        metric_type.compare("AUC") == 0) {
      best_result = kFloatMin;
      prev_result = kFloatMax;
    } else if (metric_type.compare("MAE") == 0 ||
               metric_type.compare("MAPE") == 0 ||
               metric_type.compare("RMSD") == 0) {  // regression
      best_result = kFloatMax;
      prev_result = kFloatMin;
    }
  }
  MetricInfo te_info;
  // Show header info
  if (!quiet_) { 
    show_head_info(!test_reader.empty()); 
  }
  for (int n = 1; n <= epoch_; ++n) {
    Timer timer;
    timer.tic();
    // Calc grad and update model
    real_t tr_loss = calc_gradient(train_reader);
    // we don't do any evaluation in a quiet model
    if (!quiet_) {
      if (!test_reader.empty()) { 
        te_info = calc_metric(test_reader); 
      }
      // show evaluation metric info
      show_train_info(tr_loss, 
                      te_info.loss_val,
                      te_info.metric_val,
                      timer.toc(), 
                      !test_reader.empty(), 
                      n);
      // Early-stopping
      if (early_stop_) {
        if ((metric_ == nullptr && te_info.loss_val <= best_result) ||
            (metric_ != nullptr && metric_->cmp(te_info.metric_val, 
                                                best_result))) {
          best_result = metric_ == nullptr ? 
            te_info.loss_val : te_info.metric_val;
          best_epoch = n;
          model_->SetBestModel();
        }
        if ((metric_ == nullptr && te_info.loss_val > prev_result) ||
            (metric_ != nullptr && !metric_->cmp(te_info.metric_val, 
                                                 prev_result))) {
          // If the validation loss goes up continuously
          // in stop_window epoch, we stop training
          if (stop_window == stop_window_) { break; }
          stop_window++;
        } else {
          stop_window = 0;
        }
        prev_result = metric_ == nullptr ? 
          te_info.loss_val : te_info.metric_val;
      }
    }
  }
  if (early_stop_ && best_epoch != epoch_) {  // not for cv
    std::string metric_name = metric_ == nullptr ? 
      "loss" : metric_->metric_type();
    Color::print_action(
      StringPrintf("Early-stopping at epoch %d, best %s: %f", 
        best_epoch, metric_name.c_str(), best_result)
    );
    model_->Shrink();
  } else {  // for cv
    metric_info_.push_back(te_info);
  }
}